

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O3

bool __thiscall
Rml::DecoratorTiledBox::Initialise(DecoratorTiledBox *this,Tile *_tiles,Texture *_textures)

{
  int iVar1;
  long lVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  long lVar5;
  TextureFileIndex *pTVar6;
  byte bVar7;
  Texture texture;
  
  bVar7 = 0;
  pTVar6 = &_textures->file_index;
  lVar5 = 0x30;
  do {
    puVar3 = (undefined4 *)((long)(&_tiles->tile_data + -3) + lVar5);
    puVar4 = (undefined4 *)
             ((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5);
    for (lVar2 = 0x13; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    }
    texture._8_8_ = *(undefined8 *)pTVar6;
    texture.render_manager = ((Texture *)(pTVar6 + -2))->render_manager;
    iVar1 = Decorator::AddTexture((Decorator *)this,texture);
    *(int *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5) = iVar1;
    pTVar6 = pTVar6 + 4;
    lVar5 = lVar5 + 0x4c;
  } while (lVar5 != 0x2dc);
  lVar5 = 0x30;
  do {
    if (*(int *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5) == -1)
    {
      return false;
    }
    lVar5 = lVar5 + 0x4c;
  } while (lVar5 != 0x160);
  if (*(int *)&this->field_0x290 < 0) {
    return false;
  }
  iVar1 = *(int *)&this->field_0x1ac;
  if (*(int *)&this->field_0x160 == -1) {
    if (iVar1 < 0) {
      if (iVar1 == -1) {
        return false;
      }
      goto LAB_00211f46;
    }
    puVar3 = (undefined4 *)&this->field_0x1ac;
    puVar4 = (undefined4 *)&this->field_0x160;
    for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    }
    lVar5 = 0x194;
  }
  else {
    if (*(int *)&this->field_0x160 < 0 || iVar1 != -1) goto LAB_00211f46;
    puVar3 = (undefined4 *)&this->field_0x160;
    puVar4 = (undefined4 *)&this->field_0x1ac;
    for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    }
    lVar5 = 0x1e0;
  }
  *(undefined4 *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5) = 1;
LAB_00211f46:
  iVar1 = *(int *)&this->field_0x244;
  if (*(int *)&this->field_0x1f8 == -1) {
    if (iVar1 < 0) {
      if (iVar1 != -1) {
        return true;
      }
      return false;
    }
    puVar3 = (undefined4 *)&this->field_0x244;
    puVar4 = (undefined4 *)&this->field_0x1f8;
    for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    }
    lVar5 = 0x22c;
  }
  else {
    if (*(int *)&this->field_0x1f8 < 0 || iVar1 != -1) {
      return true;
    }
    puVar3 = (undefined4 *)&this->field_0x1f8;
    puVar4 = (undefined4 *)&this->field_0x244;
    for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    }
    lVar5 = 0x278;
  }
  *(undefined4 *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5) = 2;
  return true;
}

Assistant:

bool DecoratorTiledBox::Initialise(const Tile* _tiles, const Texture* _textures)
{
	// Load the textures.
	for (int i = 0; i < 9; i++)
	{
		tiles[i] = _tiles[i];
		tiles[i].texture_index = AddTexture(_textures[i]);
	}

	// All corners must have a valid texture.
	for (int i = TOP_LEFT_CORNER; i <= BOTTOM_RIGHT_CORNER; i++)
	{
		if (tiles[i].texture_index == -1)
			return false;
	}
	// Check that the centre tile has been specified.
	if (tiles[CENTRE].texture_index < 0)
		return false;

	// If only one side of the left / right edges have been configured, then mirror the tile for the other side.
	if (tiles[LEFT_EDGE].texture_index == -1 && tiles[RIGHT_EDGE].texture_index > -1)
	{
		tiles[LEFT_EDGE] = tiles[RIGHT_EDGE];
		tiles[LEFT_EDGE].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[RIGHT_EDGE].texture_index == -1 && tiles[LEFT_EDGE].texture_index > -1)
	{
		tiles[RIGHT_EDGE] = tiles[LEFT_EDGE];
		tiles[RIGHT_EDGE].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[LEFT_EDGE].texture_index == -1 && tiles[RIGHT_EDGE].texture_index == -1)
		return false;

	// If only one side of the top / bottom edges have been configured, then mirror the tile for the other side.
	if (tiles[TOP_EDGE].texture_index == -1 && tiles[BOTTOM_EDGE].texture_index > -1)
	{
		tiles[TOP_EDGE] = tiles[BOTTOM_EDGE];
		tiles[TOP_EDGE].orientation = FLIP_VERTICAL;
	}
	else if (tiles[BOTTOM_EDGE].texture_index == -1 && tiles[TOP_EDGE].texture_index > -1)
	{
		tiles[BOTTOM_EDGE] = tiles[TOP_EDGE];
		tiles[BOTTOM_EDGE].orientation = FLIP_VERTICAL;
	}
	else if (tiles[TOP_EDGE].texture_index == -1 && tiles[BOTTOM_EDGE].texture_index == -1)
		return false;

	return true;
}